

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O3

FIOBJ fiobj_str_tmp(void)

{
  long lVar1;
  long lVar2;
  undefined1 *puVar3;
  long *in_FS_OFFSET;
  fio_str_info_s local_20;
  
  lVar1 = *in_FS_OFFSET;
  *(undefined1 *)((long)in_FS_OFFSET + -0x2e7) = 0;
  if (((char)in_FS_OFFSET[-0x5d] == '\0') &&
     (puVar3 = (undefined1 *)in_FS_OFFSET[-0x58], puVar3 != (undefined1 *)0x0)) {
    if (in_FS_OFFSET[-0x5b] == 0) {
      lVar2 = 0;
      if (in_FS_OFFSET[-0x59] == 0) {
        lVar2 = in_FS_OFFSET[-0x5a];
      }
      in_FS_OFFSET[-0x5a] = lVar2;
      fio_str_capa_assert(&local_20,(fio_str_s_conflict *)(lVar1 + -0x2e8),0);
      puVar3 = (undefined1 *)in_FS_OFFSET[-0x58];
    }
    in_FS_OFFSET[-0x5a] = 0;
  }
  else {
    *(undefined1 *)(in_FS_OFFSET + -0x5d) = 1;
    puVar3 = (undefined1 *)(lVar1 + -0x2e6);
  }
  *puVar3 = 0;
  return lVar1 - 0x2f8U | 2;
}

Assistant:

FIOBJ fiobj_str_tmp(void) {
  static __thread fiobj_str_s tmp = {
      .head =
          {
              .ref = ((~(uint32_t)0) >> 4),
              .type = FIOBJ_T_STRING,
          },
      .str = {.small = 1},
  };
  tmp.str.frozen = 0;
  fio_str_resize(&tmp.str, 0);
  return ((uintptr_t)&tmp | FIOBJECT_STRING_FLAG);
}